

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUIStaticText::getTextHeight(CGUIStaticText *this)

{
  int iVar1;
  u32 uVar2;
  long *plVar3;
  int extraout_var;
  wchar_t *pwVar4;
  int extraout_var_00;
  long *in_RDI;
  s32 height;
  IGUIFont *font;
  int local_4;
  
  plVar3 = (long *)(**(code **)(*in_RDI + 0x130))();
  if (plVar3 == (long *)0x0) {
    local_4 = 0;
  }
  else if ((*(byte *)((long)in_RDI + 0x13f) & 1) == 0) {
    pwVar4 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3ce13c);
    (**(code **)(*plVar3 + 8))(plVar3,pwVar4);
    local_4 = extraout_var_00;
  }
  else {
    (**(code **)(*plVar3 + 8))(plVar3,L"A");
    iVar1 = (**(code **)(*plVar3 + 0x38))();
    uVar2 = core::array<irr::core::string<wchar_t>_>::size
                      ((array<irr::core::string<wchar_t>_> *)0x3ce113);
    local_4 = (extraout_var + iVar1) * uVar2;
  }
  return local_4;
}

Assistant:

s32 CGUIStaticText::getTextHeight() const
{
	IGUIFont *font = getActiveFont();
	if (!font)
		return 0;

	if (WordWrap) {
		s32 height = font->getDimension(L"A").Height + font->getKerningHeight();
		return height * BrokenText.size();
	} else {
		// TODO: Text can have multiple lines which are not in BrokenText
		// This is likely not correct. But as I have no time for further
		// investigation I just fix it for now by return the true height here.
		return font->getDimension(Text.c_str()).Height;
	}
}